

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_entity_factory.cxx
# Opt level: O3

cse_abstract * __thiscall
factory_item<xray_re::cse_alife_item_custom_outfit>::create
          (factory_item<xray_re::cse_alife_item_custom_outfit> *this)

{
  cse_alife_object *this_00;
  
  this_00 = (cse_alife_object *)operator_new(0x200);
  xray_re::cse_alife_object::cse_alife_object(this_00);
  (this_00->super_cse_abstract)._vptr_cse_abstract = (_func_int **)&PTR__cse_abstract_00247d50;
  xray_re::cse_visual::cse_visual((cse_visual *)(this_00 + 1));
  (this_00->super_cse_abstract)._vptr_cse_abstract =
       (_func_int **)&PTR__cse_alife_dynamic_object_visual_00247dd0;
  this_00[1].super_cse_abstract._vptr_cse_abstract =
       (_func_int **)&PTR__cse_alife_dynamic_object_visual_00247e38;
  xray_re::cse_alife_inventory_item::cse_alife_inventory_item
            ((cse_alife_inventory_item *)((long)&this_00[1].super_cse_abstract.m_s_name.field_2 + 8)
            );
  (this_00->super_cse_abstract)._vptr_cse_abstract = (_func_int **)&PTR__cse_alife_item_002493e0;
  this_00[1].super_cse_abstract._vptr_cse_abstract =
       (_func_int **)&PTR__cse_alife_item_custom_outfit_00249448;
  *(undefined ***)((long)&this_00[1].super_cse_abstract.m_s_name.field_2 + 8) =
       &PTR__cse_alife_item_custom_outfit_00249470;
  (this_00->super_cse_abstract).m_clsid.field_0 = (this->super_factory_item_base).m_clsid.field_0;
  return &this_00->super_cse_abstract;
}

Assistant:

cse_abstract* factory_item<T>::create()
{
	T* p = new T;
	p->clsid() = clsid();
	return p;
}